

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall GdlRenderer::DebugEngineCode(GdlRenderer *this,GrcManager *pcman,ostream *strmOut)

{
  GdlRuleTable *pGVar1;
  ostream *poVar2;
  ostream *in_RDX;
  long in_RDI;
  uint32_t fxdRuleVersion;
  GdlRuleTable *prultbl;
  GrcManager *in_stack_fffffffffffffee0;
  allocator local_d1;
  string *in_stack_ffffffffffffff30;
  GdlRenderer *in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff44;
  GrcManager *in_stack_ffffffffffffff48;
  GdlRuleTable *in_stack_ffffffffffffff50;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [36];
  int local_24;
  GdlRuleTable *local_20;
  ostream *local_18;
  
  local_18 = in_RDX;
  local_24 = GrcManager::VersionForRules(in_stack_fffffffffffffee0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"linebreak",&local_49);
  pGVar1 = FindRuleTable(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  local_20 = pGVar1;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugEngineCode
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
               (ostream *)in_stack_ffffffffffffff38);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"substitution",&local_81);
  pGVar1 = FindRuleTable(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  local_20 = pGVar1;
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugEngineCode
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
               (ostream *)in_stack_ffffffffffffff38);
  }
  if (-1 < *(int *)(in_RDI + 0xc0)) {
    poVar2 = std::operator<<(local_18,"\nPASS ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0xc0) + 1);
    std::operator<<(poVar2,": bidi\n");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"justification",(allocator *)&stack0xffffffffffffff57);
  pGVar1 = FindRuleTable(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  local_20 = pGVar1;
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugEngineCode
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
               (ostream *)in_stack_ffffffffffffff38);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff30,"positioning",&local_d1);
  pGVar1 = FindRuleTable(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  local_20 = pGVar1;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugEngineCode
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
               (ostream *)in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

void GdlRenderer::DebugEngineCode(GrcManager * pcman, std::ostream & strmOut)
{
	GdlRuleTable * prultbl;

	uint32_t fxdRuleVersion = pcman->VersionForRules();

	if ((prultbl = FindRuleTable("linebreak")) != NULL)
		prultbl->DebugEngineCode(pcman, fxdRuleVersion, strmOut);

	if ((prultbl = FindRuleTable("substitution")) != NULL)
		prultbl->DebugEngineCode(pcman, fxdRuleVersion, strmOut);

	if (m_ipassBidi > -1)
		strmOut << "\nPASS " << m_ipassBidi + 1 << ": bidi\n";

	if ((prultbl = FindRuleTable("justification")) != NULL)
		prultbl->DebugEngineCode(pcman, fxdRuleVersion, strmOut);

	if ((prultbl = FindRuleTable("positioning")) != NULL)
		prultbl->DebugEngineCode(pcman, fxdRuleVersion, strmOut);
}